

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

char * getF(lua_State *L,void *ud,size_t *size)

{
  int iVar1;
  size_t sVar2;
  char *__ptr;
  
  if (*ud == 0) {
    iVar1 = feof(*(FILE **)((long)ud + 8));
    if (iVar1 == 0) {
      __ptr = (char *)((long)ud + 0x10);
      sVar2 = fread(__ptr,1,0x2000,*(FILE **)((long)ud + 8));
      *size = sVar2;
      if (sVar2 == 0) {
        __ptr = (char *)0x0;
      }
    }
    else {
      __ptr = (char *)0x0;
    }
  }
  else {
    *(undefined4 *)ud = 0;
    *size = 1;
    __ptr = "\n";
  }
  return __ptr;
}

Assistant:

static const char*getF(lua_State*L,void*ud,size_t*size){
LoadF*lf=(LoadF*)ud;
(void)L;
if(lf->extraline){
lf->extraline=0;
*size=1;
return"\n";
}
if(feof(lf->f))return NULL;
*size=fread(lf->buff,1,sizeof(lf->buff),lf->f);
return(*size>0)?lf->buff:NULL;
}